

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::getFilterTypes
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *filterTypes,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *png)

{
  uint uVar1;
  size_type sVar2;
  const_reference __x;
  reference pvVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  State *in_RDI;
  size_t i;
  uint h;
  uint w;
  State state;
  uint error;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  passes;
  State *in_stack_fffffffffffffd80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd88;
  State *in_stack_fffffffffffffd90;
  LodePNGState *state_00;
  undefined4 in_stack_fffffffffffffda0;
  uint *in_stack_fffffffffffffda8;
  ulong uVar4;
  uint local_250;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  State *local_10;
  uint local_4;
  
  state_00 = (LodePNGState *)&stack0xffffffffffffffd0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)0x13f859);
  uVar1 = getFilterTypesInterlaced
                    ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)state.super_LodePNGState.info_png._56_8_,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     state.super_LodePNGState.info_png.color._32_8_);
  local_4 = uVar1;
  if (uVar1 == 0) {
    sVar2 = std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)&stack0xffffffffffffffd0);
    if (sVar2 == 1) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)&stack0xffffffffffffffd0,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_10,
                 in_stack_fffffffffffffd88);
    }
    else {
      State::State(in_stack_fffffffffffffd90);
      __x = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_18,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18);
      lodepng_inspect(in_stack_fffffffffffffda8,(uint *)CONCAT44(uVar1,in_stack_fffffffffffffda0),
                      state_00,(uchar *)in_stack_fffffffffffffd90,(size_t)__x);
      for (uVar4 = 0; uVar4 < local_250; uVar4 = uVar4 + 1) {
        in_stack_fffffffffffffd80 = local_10;
        if ((uVar4 & 1) == 0) {
          pvVar3 = std::
                   vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&stack0xffffffffffffffd0,5);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar3,uVar4 >> 1);
        }
        else {
          pvVar3 = std::
                   vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&stack0xffffffffffffffd0,6);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar3,uVar4 >> 1);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffd90,__x);
      }
      State::~State(in_stack_fffffffffffffd80);
      local_10 = in_stack_fffffffffffffd90;
    }
    local_4 = 0;
    in_stack_fffffffffffffd90 = local_10;
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffffd90);
  return local_4;
}

Assistant:

unsigned getFilterTypes(std::vector<unsigned char>& filterTypes, const std::vector<unsigned char>& png) {
  std::vector<std::vector<unsigned char> > passes;
  unsigned error = getFilterTypesInterlaced(passes, png);
  if(error) return error;

  if(passes.size() == 1) {
    filterTypes.swap(passes[0]);
  } else {
    lodepng::State state;
    unsigned w, h;
    lodepng_inspect(&w, &h, &state, &png[0], png.size());
    /*
    Interlaced. Simplify it: put pass 6 and 7 alternating in the one vector so
    that one filter per scanline of the uninterlaced image is given, with that
    filter corresponding the closest to what it would be for non-interlaced
    image.
    */
    for(size_t i = 0; i < h; i++) {
      filterTypes.push_back(i % 2 == 0 ? passes[5][i / 2] : passes[6][i / 2]);
    }
  }
  return 0; /* OK */
}